

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O3

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  FT_Byte FVar1;
  FT_Memory pFVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  FT_ULong FVar6;
  ushort uVar7;
  short sVar8;
  FT_Error FVar9;
  int iVar10;
  PCF_Table pPVar11;
  FT_ULong FVar12;
  PCF_Table pPVar13;
  FT_Pointer P;
  PCF_Metric metric;
  FT_Byte *buffer;
  FT_Pointer pvVar14;
  PCF_Property pPVar15;
  FT_String *pFVar16;
  FT_Bitmap_Size *pFVar17;
  ulong uVar18;
  FT_Long FVar19;
  PCF_Property pPVar20;
  char *pcVar21;
  short sVar22;
  int iVar23;
  ulong uVar24;
  FT_ULong FVar25;
  short sVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  FT_Frame_Field *fields;
  ulong uVar30;
  PCF_Table pPVar31;
  long lVar32;
  FT_Bitmap_Size *bsize;
  FT_Error error;
  FT_ULong size;
  FT_Error local_98;
  FT_Error local_94;
  FT_ULong local_90;
  FT_ULong local_88;
  undefined8 local_80;
  PCF_Property local_78;
  ulong local_70;
  FT_Memory local_68;
  ulong local_60;
  FT_ULong local_58;
  FT_ULong FStack_50;
  FT_ULong local_48;
  FT_ULong FStack_40;
  
  pFVar2 = (face->root).memory;
  FVar9 = FT_Stream_Seek(stream,0);
  if (FVar9 != 0) {
    return 3;
  }
  local_80._0_4_ = FT_Stream_ReadFields(stream,pcf_toc_header,&face->toc);
  if ((FT_Error)local_80 != 0) {
    return 3;
  }
  if ((face->toc).version != 0x70636601) {
    return 3;
  }
  uVar24 = (face->toc).count;
  if (uVar24 == 0) {
    return 3;
  }
  uVar18 = stream->size;
  if (uVar18 < 0x10) {
    return 3;
  }
  if (9 < uVar24 || uVar18 >> 4 < uVar24) {
    uVar24 = 9;
    if (uVar18 < 0x90) {
      uVar24 = uVar18 >> 4;
    }
    (face->toc).count = uVar24;
  }
  pPVar11 = (PCF_Table)ft_mem_realloc(pFVar2,0x20,0,uVar24,(void *)0x0,(FT_Error *)&local_80);
  (face->toc).tables = pPVar11;
  if ((FT_Error)local_80 != 0) {
    return 3;
  }
  local_68 = pFVar2;
  if ((face->toc).count == 0) {
    uVar24 = 0;
LAB_00146ea4:
    uVar18 = 0;
    while (uVar24 != uVar18 + 1) {
      bVar3 = false;
      uVar27 = 0;
      FVar12 = pPVar11->offset;
      uVar30 = 1;
      do {
        pPVar13 = pPVar11 + uVar27;
        uVar29 = pPVar11[uVar30].offset;
        if (uVar29 < FVar12) {
          pPVar31 = pPVar11 + uVar30;
          local_58 = pPVar13->type;
          FStack_50 = pPVar13->format;
          local_48 = pPVar13->size;
          FStack_40 = pPVar13->offset;
          FVar12 = pPVar31->type;
          FVar25 = pPVar31->format;
          FVar6 = pPVar31->offset;
          pPVar13->size = pPVar31->size;
          pPVar13->offset = FVar6;
          pPVar13->type = FVar12;
          pPVar13->format = FVar25;
          pPVar31->size = local_48;
          pPVar31->offset = FStack_40;
          pPVar31->type = local_58;
          pPVar31->format = FStack_50;
          uVar29 = pPVar31->offset;
          bVar3 = true;
        }
        if ((uVar29 < pPVar13->size) || (uVar29 - pPVar13->size < pPVar13->offset)) {
          local_80._0_4_ = 9;
          goto LAB_00146fb0;
        }
        uVar24 = (face->toc).count;
        bVar4 = uVar30 < uVar24 + ~uVar18;
        uVar27 = uVar30;
        FVar12 = uVar29;
        uVar30 = (ulong)((int)uVar30 + 1);
      } while (bVar4);
      if ((!bVar3) || (uVar18 = (ulong)((int)uVar18 + 1), uVar24 - 1 <= uVar18)) break;
    }
    pPVar11 = (face->toc).tables;
    uVar18 = stream->size;
    pPVar13 = pPVar11;
    if (uVar24 != 1) {
      uVar28 = 1;
      do {
        if ((uVar18 < pPVar13->size) || (uVar18 - pPVar13->size < pPVar13->offset))
        goto LAB_00146e90;
        pPVar13 = pPVar13 + 1;
        uVar27 = (ulong)uVar28;
        uVar28 = uVar28 + 1;
      } while (uVar27 < uVar24 - 1);
    }
  }
  else {
    uVar18 = 1;
    iVar10 = (FT_Error)local_80;
    do {
      local_80._0_4_ = iVar10;
      local_80._0_4_ = FT_Stream_ReadFields(stream,pcf_table_header,pPVar11);
      if ((FT_Error)local_80 != 0) goto LAB_00146fb0;
      pPVar11 = pPVar11 + 1;
      uVar24 = (face->toc).count;
      bVar3 = uVar18 < uVar24;
      uVar18 = (ulong)((int)uVar18 + 1);
      iVar10 = 0;
    } while (bVar3);
    pPVar11 = (face->toc).tables;
    if (uVar24 != 1) goto LAB_00146ea4;
    uVar18 = stream->size;
    pPVar13 = pPVar11;
  }
  uVar24 = uVar18 - pPVar13->offset;
  if (uVar18 < pPVar13->offset) {
LAB_00146e90:
    local_80._0_4_ = 8;
LAB_00146fb0:
    ft_mem_free(local_68,(face->toc).tables);
    (face->toc).tables = (PCF_Table)0x0;
    local_94 = (FT_Error)local_80;
    if ((FT_Error)local_80 != 0) {
      return 3;
    }
    pPVar11 = (PCF_Table)0x0;
  }
  else {
    if (uVar24 < pPVar13->size) {
      pPVar13->size = uVar24;
    }
    local_94 = 0;
  }
  (face->root).num_faces = 1;
  (face->root).face_index = 0;
  if (face_index < 0) {
    return 0;
  }
  pFVar2 = (face->root).memory;
  local_98 = pcf_seek_to_table_type(stream,pPVar11,(face->toc).count,1,&local_58,&local_80);
  if ((local_98 == 0) &&
     (FVar12 = FT_Stream_ReadULongLE(stream,&local_98), (FVar12 & 0xffffff00) == 0 && local_98 == 0)
     ) {
    if ((FVar12 & 4) == 0) {
      uVar24 = FT_Stream_ReadULongLE(stream,&local_98);
    }
    else {
      uVar24 = FT_Stream_ReadULong(stream,&local_98);
    }
    if (local_98 != 0) goto LAB_001470b3;
    local_90 = FVar12;
    if (CONCAT44(local_80._4_4_,(FT_Error)local_80) / 9 < uVar24) {
      local_98 = 8;
      goto LAB_001470b3;
    }
    local_70 = 0x100;
    if (uVar24 < 0x100) {
      local_70 = uVar24;
    }
    face->nprops = (int)local_70;
    buffer = (FT_Byte *)0x0;
    local_88 = uVar24;
    local_60 = CONCAT44(local_80._4_4_,(FT_Error)local_80);
    P = ft_mem_realloc(pFVar2,0x18,0,local_70,(void *)0x0,&local_98);
    if (local_98 == 0) {
      if (local_88 != 0) {
        local_78 = (PCF_Property)(local_70 * 0x18);
        buffer = (FT_Byte *)0x0;
        pPVar15 = (PCF_Property)0x0;
        FVar9 = local_98;
        do {
          local_98 = FVar9;
          if ((local_90 & 4) == 0) {
            fields = pcf_property_header;
          }
          else {
            fields = pcf_property_msb_header;
          }
          local_98 = FT_Stream_ReadFields(stream,fields,(void *)((long)P + (long)pPVar15));
          if (local_98 != 0) goto LAB_001470b8;
          pPVar15 = pPVar15 + 1;
          local_98 = 0;
          FVar9 = 0;
        } while (local_78 != pPVar15);
      }
      local_98 = FT_Stream_Skip(stream,(local_88 - local_70) * 9);
      if (local_98 == 0) {
        FVar9 = 0;
        if (((local_88 & 3) != 0) && (FVar9 = FT_Stream_Skip(stream,4 - (local_88 & 3)), FVar9 != 0)
           ) goto LAB_00147251;
        local_98 = FVar9;
        if ((local_90 & 4) == 0) {
          uVar24 = FT_Stream_ReadULongLE(stream,&local_98);
        }
        else {
          uVar24 = FT_Stream_ReadULong(stream,&local_98);
        }
        if (local_98 == 0) {
          if (uVar24 <= local_60 + local_88 * -9) {
            uVar18 = 0x1000100;
            if (uVar24 < 0x1000100) {
              uVar18 = uVar24;
            }
            buffer = (FT_Byte *)ft_mem_realloc(pFVar2,1,0,uVar18 + 1,(void *)0x0,&local_98);
            if (((local_98 == 0) && (local_98 = FT_Stream_Read(stream,buffer,uVar18), local_98 == 0)
                ) && (local_78 = (PCF_Property)
                                 ft_mem_realloc(pFVar2,0x18,0,local_70,(void *)0x0,&local_98),
                     local_98 == 0)) {
              face->properties = local_78;
              if (local_88 != 0) {
                local_88 = local_70 * 0x18;
                local_90 = 0;
                do {
                  if (uVar18 < *(ulong *)((long)P + local_90)) {
LAB_00147825:
                    local_98 = 9;
                    goto LAB_001470b8;
                  }
                  pvVar14 = ft_mem_strdup(pFVar2,(char *)(buffer + *(ulong *)((long)P + local_90)),
                                          &local_98);
                  *(FT_Pointer *)((long)&local_78->name + local_90) = pvVar14;
                  if (local_98 != 0) goto LAB_001470b8;
                  FVar1 = *(FT_Byte *)((long)P + local_90 + 8);
                  (&local_78->isString)[local_90] = FVar1;
                  uVar24 = *(ulong *)((long)P + local_90 + 0x10);
                  if (FVar1 == '\0') {
                    *(ulong *)((long)&local_78->value + local_90) = uVar24;
                  }
                  else {
                    if (uVar18 < uVar24) goto LAB_00147825;
                    pvVar14 = ft_mem_strdup(pFVar2,(char *)(buffer + uVar24),&local_98);
                    *(FT_Pointer *)((long)&local_78->value + local_90) = pvVar14;
                    if (local_98 != 0) goto LAB_001470b8;
                  }
                  local_90 = local_90 + 0x18;
                } while (local_88 != local_90);
              }
              local_98 = 0;
            }
            goto LAB_001470b8;
          }
          local_98 = 8;
        }
      }
      else {
LAB_00147251:
        local_98 = 0x53;
      }
      buffer = (FT_Byte *)0x0;
    }
  }
  else {
LAB_001470b3:
    buffer = (FT_Byte *)0x0;
    P = (void *)0x0;
  }
LAB_001470b8:
  ft_mem_free(pFVar2,P);
  ft_mem_free(pFVar2,buffer);
  local_94 = local_98;
  if (local_98 != 0) {
    return 3;
  }
  FVar12 = (face->toc).count;
  if (FVar12 != 0) {
    pPVar11 = (face->toc).tables;
    pPVar13 = pPVar11;
    FVar25 = FVar12;
    do {
      if (pPVar13->type == 0x100) {
        bVar3 = false;
        goto LAB_00147136;
      }
      pPVar13 = pPVar13 + 1;
      FVar25 = FVar25 - 1;
    } while (FVar25 != 0);
  }
  FVar9 = pcf_get_accel(stream,face,2);
  if (FVar9 != 0) {
    return 3;
  }
  FVar12 = (face->toc).count;
  pPVar11 = (face->toc).tables;
  bVar3 = true;
  local_94 = 0;
LAB_00147136:
  pFVar2 = (face->root).memory;
  local_98 = pcf_seek_to_table_type(stream,pPVar11,FVar12,4,&local_58,&local_80);
  if (local_98 != 0) {
    return 3;
  }
  local_90 = FT_Stream_ReadULongLE(stream,&local_98);
  if (local_98 != 0) {
    return 3;
  }
  if ((local_90 & 0xfffffe00) != 0) {
    return 3;
  }
  uVar24 = local_90 & 0xffffff00;
  if ((local_90 & 0xffffff00) == 0) {
    if ((local_90 & 4) == 0) {
      FVar12 = FT_Stream_ReadULongLE(stream,&local_98);
    }
    else {
      FVar12 = FT_Stream_ReadULong(stream,&local_98);
    }
  }
  else {
    if ((local_90 & 4) == 0) {
      uVar7 = FT_Stream_ReadUShortLE(stream,&local_98);
    }
    else {
      uVar7 = FT_Stream_ReadUShort(stream,&local_98);
    }
    FVar12 = (FT_ULong)uVar7;
  }
  if (local_98 != 0) {
    return 3;
  }
  if (uVar24 == 0) {
    uVar24 = CONCAT44(local_80._4_4_,(FT_Error)local_80) / 0xc;
  }
  else {
    uVar24 = CONCAT44(local_80._4_4_,(FT_Error)local_80) / 5;
  }
  if (uVar24 <= FVar12 - 1) {
    return 3;
  }
  uVar24 = 0x10000;
  if (FVar12 < 0x10000) {
    uVar24 = FVar12;
  }
  face->nmetrics = uVar24;
  metric = (PCF_Metric)ft_mem_realloc(pFVar2,0x18,0,uVar24,(void *)0x0,&local_98);
  face->metrics = metric;
  iVar10 = local_98;
  if (local_98 != 0) {
    return 3;
  }
  do {
    local_98 = iVar10;
    local_98 = pcf_get_metric(stream,local_90,metric);
    metric->bits = 0;
    if (local_98 != 0) {
      ft_mem_free(pFVar2,face->metrics);
      face->metrics = (PCF_Metric)0x0;
      local_94 = local_98;
      if (local_98 != 0) {
        return 3;
      }
      goto LAB_0014744f;
    }
    if ((metric->rightSideBearing < metric->leftSideBearing) ||
       (SBORROW4((int)metric->ascent,-(int)metric->descent) !=
        (int)metric->ascent + (int)metric->descent < 0)) {
      metric->descent = 0;
      metric->leftSideBearing = 0;
      metric->rightSideBearing = 0;
      metric->characterWidth = 0;
      metric->ascent = 0;
    }
    metric = metric + 1;
    uVar24 = uVar24 - 1;
    iVar10 = 0;
  } while (uVar24 != 0);
  local_94 = 0;
LAB_0014744f:
  pFVar2 = (face->root).memory;
  FVar9 = pcf_seek_to_table_type(stream,(face->toc).tables,(face->toc).count,8,&local_58,&local_80);
  if (FVar9 != 0) {
    return 3;
  }
  local_98 = FT_Stream_EnterFrame(stream,8);
  if (local_98 != 0) {
    return 3;
  }
  local_90 = FT_Stream_GetULongLE(stream);
  if ((local_90 & 4) == 0) {
    local_88 = FT_Stream_GetULongLE(stream);
  }
  else {
    local_88 = FT_Stream_GetULong(stream);
  }
  FT_Stream_ExitFrame(stream);
  if ((local_90 & 0xffffff00) != 0) {
    return 3;
  }
  FVar12 = 0x10000;
  if (local_88 < 0x10000) {
    FVar12 = local_88;
  }
  if (FVar12 != face->nmetrics) {
    return 3;
  }
  local_78 = (PCF_Property)ft_mem_realloc(pFVar2,8,0,FVar12,(void *)0x0,&local_98);
  if (local_98 != 0) {
    return 3;
  }
  if (local_88 == 0) {
LAB_001476d0:
    lVar32 = 4;
    do {
      if ((local_90 & 4) == 0) {
        FT_Stream_ReadULongLE(stream,&local_98);
      }
      else {
        FT_Stream_ReadULong(stream,&local_98);
      }
      if (local_98 != 0) goto LAB_00147755;
      lVar32 = lVar32 + -1;
    } while (lVar32 != 0);
    if (local_88 != 0) {
      lVar32 = 0;
      pPVar15 = local_78;
      do {
        uVar24 = *(ulong *)pPVar15;
        if ((-1 < (long)uVar24) && (uVar24 <= CONCAT44(local_80._4_4_,(FT_Error)local_80))) {
          (&face->metrics->bits)[lVar32] = uVar24 + stream->pos;
        }
        lVar32 = lVar32 + 3;
        pPVar15 = (PCF_Property)((long)pPVar15 + 8);
      } while (FVar12 * 3 != lVar32);
    }
    face->bitmapsFormat = local_90;
  }
  else {
    FVar25 = 0;
    do {
      if ((local_90 & 4) == 0) {
        uVar24 = FT_Stream_ReadULongLE(stream,&local_98);
      }
      else {
        uVar24 = FT_Stream_ReadULong(stream,&local_98);
      }
      *(ulong *)((long)local_78 + FVar25 * 8) = uVar24;
      FVar25 = FVar25 + 1;
    } while (FVar12 != FVar25);
    if (local_98 == 0) goto LAB_001476d0;
  }
LAB_00147755:
  ft_mem_free(pFVar2,local_78);
  local_94 = local_98;
  if (local_98 != 0) {
    return 3;
  }
  local_94 = pcf_get_encodings(stream,face);
  if (local_94 != 0) {
    return 3;
  }
  FVar9 = 0;
  if ((!bVar3) && (FVar9 = pcf_get_accel(stream,face,0x100), FVar9 != 0)) {
    return 3;
  }
  local_94 = FVar9;
  uVar24 = (face->root).face_flags;
  (face->root).face_flags = uVar24 | 0x92;
  if ((face->accel).constantWidth != '\0') {
    (face->root).face_flags = uVar24 | 0x96;
  }
  local_94 = pcf_interpret_style(face);
  if (local_94 != 0) {
    return 3;
  }
  pPVar15 = pcf_find_property(face,"FAMILY_NAME");
  pFVar2 = local_68;
  if ((pPVar15 == (PCF_Property)0x0) || (pPVar15->isString == '\0')) {
    (face->root).family_name = (FT_String *)0x0;
  }
  else {
    pFVar16 = (FT_String *)ft_mem_strdup(local_68,(pPVar15->value).atom,&local_94);
    (face->root).family_name = pFVar16;
    if (local_94 != 0) {
      return 3;
    }
  }
  (face->root).num_glyphs = face->nmetrics + 1;
  (face->root).num_fixed_sizes = 1;
  pFVar17 = (FT_Bitmap_Size *)ft_mem_realloc(pFVar2,0x20,0,1,(void *)0x0,&local_94);
  (face->root).available_sizes = pFVar17;
  if (local_94 != 0) {
    return 3;
  }
  pFVar17->x_ppem = 0;
  pFVar17->y_ppem = 0;
  pFVar17->height = 0;
  pFVar17->width = 0;
  *(undefined4 *)&pFVar17->field_0x4 = 0;
  pFVar17->size = 0;
  uVar18 = (face->accel).fontDescent + (face->accel).fontAscent;
  uVar24 = -uVar18;
  if (0 < (long)uVar18) {
    uVar24 = uVar18;
  }
  sVar8 = 0x7fff;
  if (uVar24 < 0x8000) {
    sVar26 = (short)uVar18;
    sVar8 = -sVar26;
    if (0 < sVar26) {
      sVar8 = sVar26;
    }
  }
  pFVar17->height = sVar8;
  pPVar15 = pcf_find_property(face,"AVERAGE_WIDTH");
  if (pPVar15 == (PCF_Property)0x0) {
    FVar19 = FT_MulDiv((long)sVar8,2,3);
    sVar8 = (short)FVar19;
  }
  else {
    FVar12 = (pPVar15->value).ul;
    uVar24 = -FVar12;
    if (0 < (long)FVar12) {
      uVar24 = FVar12;
    }
    sVar8 = 0x7fff;
    if (uVar24 < 0x4fff2) {
      auVar5 = SEXT816((long)(FVar12 + 5)) * SEXT816(0x6666666666666667);
      sVar26 = (short)(auVar5._8_4_ >> 2) - (auVar5._14_2_ >> 0xf);
      sVar8 = -sVar26;
      if (0 < sVar26) {
        sVar8 = sVar26;
      }
    }
  }
  pFVar17->width = sVar8;
  pPVar15 = pcf_find_property(face,"POINT_SIZE");
  if (pPVar15 != (PCF_Property)0x0) {
    uVar24 = (pPVar15->value).l;
    uVar18 = -uVar24;
    if (0 < (long)uVar24) {
      uVar18 = uVar24;
    }
    FVar19 = 0x7fff;
    if (uVar18 < 0x504c3) {
      FVar19 = FT_MulDiv(uVar18,0x70800,0x11a4e);
    }
    pFVar17->size = FVar19;
  }
  pPVar15 = pcf_find_property(face,"PIXEL_SIZE");
  if (pPVar15 != (PCF_Property)0x0) {
    FVar12 = (pPVar15->value).ul;
    uVar24 = -FVar12;
    if (0 < (long)FVar12) {
      uVar24 = FVar12;
    }
    uVar18 = 0x1fffc0;
    if (uVar24 < 0x8000) {
      iVar23 = (int)(short)FVar12;
      iVar10 = -iVar23;
      if (0 < iVar23) {
        iVar10 = iVar23;
      }
      uVar18 = (ulong)(uint)(iVar10 << 6);
    }
    pFVar17->y_ppem = uVar18;
  }
  pPVar15 = pcf_find_property(face,"RESOLUTION_X");
  if (pPVar15 == (PCF_Property)0x0) {
    sVar8 = 0;
  }
  else {
    uVar24 = (pPVar15->value).l;
    uVar18 = -uVar24;
    if (0 < (long)uVar24) {
      uVar18 = uVar24;
    }
    sVar8 = 0x7fff;
    if (uVar18 < 0x8000) {
      sVar26 = (short)uVar24;
      sVar8 = -sVar26;
      if (0 < sVar26) {
        sVar8 = sVar26;
      }
    }
  }
  pPVar15 = pcf_find_property(face,"RESOLUTION_Y");
  if (pPVar15 == (PCF_Property)0x0) {
    FVar19 = pFVar17->y_ppem;
    if (FVar19 == 0) {
      FVar19 = pFVar17->size;
      pFVar17->y_ppem = FVar19;
    }
    goto LAB_00147aab;
  }
  uVar24 = (pPVar15->value).l;
  uVar18 = -uVar24;
  if (0 < (long)uVar24) {
    uVar18 = uVar24;
  }
  if (uVar18 < 0x8000) {
    sVar22 = (short)uVar24;
    sVar26 = -sVar22;
    if (0 < sVar22) {
      sVar26 = sVar22;
    }
    FVar19 = pFVar17->y_ppem;
    if (FVar19 == 0) {
      FVar19 = pFVar17->size;
      pFVar17->y_ppem = FVar19;
      if ((uVar24 & 0xffff) == 0) goto LAB_00147aab;
      goto LAB_00147a7c;
    }
  }
  else {
    FVar19 = pFVar17->y_ppem;
    sVar26 = 0x7fff;
    if (FVar19 == 0) {
      FVar19 = pFVar17->size;
      pFVar17->y_ppem = FVar19;
      sVar26 = 0x7fff;
LAB_00147a7c:
      FVar19 = FT_MulDiv(FVar19,(long)sVar26,0x48);
      pFVar17->y_ppem = FVar19;
    }
  }
  if ((sVar8 != 0) && (sVar26 != 0)) {
    FVar19 = FT_MulDiv(FVar19,(long)sVar8,(long)sVar26);
  }
LAB_00147aab:
  pFVar17->x_ppem = FVar19;
  pPVar15 = pcf_find_property(face,"CHARSET_REGISTRY");
  pPVar20 = pcf_find_property(face,"CHARSET_ENCODING");
  pFVar2 = local_68;
  if (((pPVar15 != (PCF_Property)0x0) && (pPVar20 != (PCF_Property)0x0 && pPVar15->isString != '\0')
      ) && (pPVar20->isString != '\0')) {
    pcVar21 = (char *)ft_mem_strdup(local_68,(pPVar20->value).atom,&local_94);
    face->charset_encoding = pcVar21;
    if (local_94 != 0) {
      return 3;
    }
    pcVar21 = (char *)ft_mem_strdup(pFVar2,(pPVar15->value).atom,&local_94);
    face->charset_registry = pcVar21;
  }
  if (local_94 != 0) {
    return 3;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL  |
                          FT_FACE_FLAG_FAST_GLYPHS;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_NEW_ARRAY( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      /*
       * Note: We shift all glyph indices by +1 since we must
       * respect the convention that glyph 0 always corresponds
       * to the `missing glyph'.
       *
       * This implies bumping the number of `available' glyphs by 1.
       */
      root->num_glyphs = (FT_Long)( face->nmetrics + 1 );

      root->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( root->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        FT_ZERO( bsize );

        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }